

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

toktldef *
prsvlst(prscxdef *ctx,toktldef *lcltab,prsndef **inits,int *locals,int args,int *varargs,uint curfr)

{
  ushort uVar1;
  int iVar2;
  prsndef *ppVar3;
  int *in_RCX;
  long *in_RDX;
  prsndef *in_RSI;
  prsndef *in_RDI;
  int in_R8D;
  undefined4 *in_R9;
  uint siz;
  tokdef t2;
  prsndef *n4;
  uchar *linrec;
  uint oldofs;
  prsndef *expr;
  int tnum;
  tokdef *t;
  prsndef *in_stack_fffffffffffffee8;
  errcxdef *in_stack_fffffffffffffef0;
  prsndef *in_stack_fffffffffffffef8;
  errcxdef *in_stack_ffffffffffffff00;
  int t_00;
  prscxdef *ctx_00;
  prsndef *ppVar4;
  uint curfr_00;
  prscxdef *ctx_01;
  tokcxdef *in_stack_ffffffffffffffa8;
  prsndef *local_10;
  
  toknext(in_stack_ffffffffffffffa8);
  local_10 = in_RSI;
  if (in_RSI == (prsndef *)0x0) {
    if (*(ushort *)((long)&in_RDI[1].prsnv + 0x40) < 0x5c) {
      errsigf(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,0);
    }
    local_10 = (prsndef *)osrndpt(in_RDI[1].prsnv.prsnvn[7]);
    toktlini(in_stack_ffffffffffffff00,(toktldef *)in_stack_fffffffffffffef8,
             (uchar *)in_stack_fffffffffffffef0,(uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    *(prsndef **)((long)&local_10->prsnv + 0x18) = ((in_RDI->prsnv).prsnvn[0]->prsnv).prsnvn[4];
    ((in_RDI->prsnv).prsnvn[0]->prsnv).prsnvn[4] = local_10;
  }
  while (*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) == 0x38) {
    *in_RCX = *in_RCX + 1;
    ppVar3 = (in_RDI->prsnv).prsnvn[0];
    ctx_00 = (prscxdef *)((toktdef *)&local_10->prsntyp)->toktfadd;
    ctx_01 = (prscxdef *)&ppVar3[2].prsnv.prsnvt.toksym;
    if (in_R8D == 0) {
      t_00 = *in_RCX;
    }
    else {
      t_00 = -*in_RCX;
    }
    ppVar4 = local_10;
    (*(code *)ctx_00)(local_10,ctx_01,*(undefined4 *)((long)&ppVar3[2].prsnv + 0x2c),4,t_00,
                      *(undefined4 *)((long)&ppVar3[2].prsnv + 0x3c));
    curfr_00 = (uint)((ulong)ppVar4 >> 0x20);
    iVar2 = toknext(in_stack_ffffffffffffffa8);
    if (((iVar2 == 0x9e) || (iVar2 == 7)) && (in_RDX != (long *)0x0)) {
      toknext(in_stack_ffffffffffffffa8);
      if (((undefined1  [112])((undefined1  [112])in_RDI[1].prsnv & (undefined1  [112])0x1) ==
           (undefined1  [112])0x0) ||
         ((*(ushort *)((long)&((in_RDI->prsnv).prsnvn[0]->prsnv).prsnvn[2][1].prsnv + 0x48) & 4) !=
          0)) {
        in_stack_fffffffffffffef0 = (errcxdef *)prsxini((prscxdef *)in_stack_fffffffffffffef0);
        in_stack_fffffffffffffee8 = in_RDI;
        prsnew0((prscxdef *)in_stack_fffffffffffffef0,(tokdef *)in_RDI);
        ppVar3 = prsnew3(ctx_00,t_00,(prsndef *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         (prsndef *)in_stack_fffffffffffffef0);
        *in_RDX = (long)ppVar3;
      }
      else {
        uVar1 = *(ushort *)((long)(in_RDI->prsnv).prsnvn[4] + 0x12);
        prsclin(ctx_01,curfr_00,(lindef *)ctx_00,t_00,(uchar *)in_stack_ffffffffffffff00);
        in_stack_ffffffffffffffa8 =
             (tokcxdef *)
             prsbalo((prscxdef *)in_stack_fffffffffffffef0,
                     (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        memcpy(in_stack_ffffffffffffffa8,
               (void *)(*(long *)((long)(in_RDI->prsnv).prsnvn[4] + 0x18) + (ulong)(uint)uVar1),
               (ulong)((uint)*(ushort *)((long)(in_RDI->prsnv).prsnvn[4] + 0x12) - (uint)uVar1));
        *(ushort *)((long)(in_RDI->prsnv).prsnvn[4] + 0x12) = uVar1;
        prsnew0((prscxdef *)in_stack_fffffffffffffef0,(tokdef *)in_stack_fffffffffffffee8);
        in_stack_ffffffffffffff00 = (errcxdef *)prsxini((prscxdef *)in_stack_fffffffffffffef0);
        in_stack_fffffffffffffef8 = in_RDI;
        prsnew0((prscxdef *)in_stack_fffffffffffffef0,(tokdef *)in_stack_fffffffffffffee8);
        ppVar3 = prsnew4(ctx_00,t_00,(prsndef *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         (prsndef *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        *in_RDX = (long)ppVar3;
      }
      *(long *)(*(long *)(*in_RDX + 0x10) + 0x10) = (long)*in_RCX;
    }
    if (*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) != 0x3f) break;
    toknext(in_stack_ffffffffffffffa8);
  }
  if ((in_R9 != (undefined4 *)0x0) &&
     (*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) == 0xcc)) {
    *in_R9 = 1;
    toknext(in_stack_ffffffffffffffa8);
  }
  in_RDI[1].prsnv.prsnvn[7] = (local_10->prsnv).prsnvn[6];
  *(short *)((long)&in_RDI[1].prsnv + 0x40) = (short)*(undefined4 *)((long)&local_10->prsnv + 0x3c);
  return (toktldef *)local_10;
}

Assistant:

static toktldef *prsvlst(prscxdef *ctx, toktldef *lcltab, prsndef **inits,
                         int *locals, int args, int *varargs, uint curfr)
{
    tokdef   *t;

    /* skip whatever token encouraged caller to parse a variable list */
    toknext(ctx->prscxtok);
    
    /* if caller doesn't already have a local table, allocate one now */
    if (!lcltab)
    {
        /* ensure there's enough space */
        if (ctx->prscxslcl < sizeof(toktldef) + 20)
            errsig(ctx->prscxerr, ERR_NOMEMLC);
        
        /* set up space for linear table and initialize it */
        lcltab = (toktldef *)osrndpt(ctx->prscxplcl);
        toktlini(ctx->prscxerr, lcltab, (uchar *)(lcltab + 1),
                 (int)ctx->prscxslcl - (uint)sizeof(toktldef));
        
        /* make new local symbol table the head of search list */
        lcltab->toktlsc.toktnxt = ctx->prscxtok->tokcxstab;
        ctx->prscxtok->tokcxstab = &lcltab->toktlsc;
    }

    for (;;)
    {
        int tnum;
        
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTSYMBOL) break;
        
        /* add the symbol */
        ++(*locals);
        t = &ctx->prscxtok->tokcxcur;
        (*lcltab->toktlsc.toktfadd)((toktdef *)lcltab, t->toknam, t->toklen,
                                    TOKSTLOCAL, (args ? -(*locals) : *locals),
                                    t->tokhash);
            
        /* check for initializer if initializers are ok */
        if (((tnum = toknext(ctx->prscxtok)) == TOKTASSIGN || tnum == TOKTEQ)
            && inits)
        {
            prsndef *expr;

            toknext(ctx->prscxtok);                          /* skip the := */
            
            /* save the OPCLINE if necessary */
            if ((ctx->prscxflg & PRSCXFLIN)
                && !(ctx->prscxtok->tokcxlin->linflg & LINFDBG))
            {
                uint     oldofs = ctx->prscxemt->emtcxofs;       /* save PC */
                uchar   *linrec;
                prsndef *n4;
                tokdef   t2;
                uint     siz;

                /* gen the OPCLINE, and copy into temp storage in tree */
                prsclin(ctx, curfr, ctx->prscxtok->tokcxlin, FALSE, 0);
                siz = ctx->prscxemt->emtcxofs - oldofs;
                linrec = prsbalo(ctx, siz);
                memcpy(linrec, ctx->prscxemt->emtcxptr + oldofs,
                       (size_t)(ctx->prscxemt->emtcxofs - oldofs));
                
                /* now remove the OPCLINE - this isn't the place for it */
                ctx->prscxemt->emtcxofs = oldofs;

                /* allocate a token node to hold the line information */
                t2.tokofs = linrec - ctx->prscxpool;
                n4 = prsnew0(ctx, &t2);

                /* now build a four-way node with the line information */
                expr = prsxini(ctx);
                *inits = prsnew4(ctx, TOKTLOCAL, expr, prsnew0(ctx, t),
                                 *inits, n4);
            }
            else
            {
                expr = prsxini(ctx);               /* parse the initializer */
                *inits = prsnew3(ctx, TOKTLOCAL, expr,
                                 prsnew0(ctx, t), *inits);
            }
            (*inits)->prsnv.prsnvn[1]->prsnv.prsnvt.tokval = *locals;
        }

        /* if we don't have a comma, we're done */
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTCOMMA) break;
        toknext(ctx->prscxtok);                           /* skip the comma */
    }
    
    /* check for varargs specifier */
    if (varargs && ctx->prscxtok->tokcxcur.toktyp == TOKTELLIPSIS)
    {
        *varargs = TRUE;
        toknext(ctx->prscxtok);                        /* skip the ellipsis */
    }
    
    /* update the local table pool pointers to follow the table */
    ctx->prscxplcl = lcltab->toktlnxt;
    ctx->prscxslcl = lcltab->toktlsiz;
    
    return(lcltab);
}